

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  bool bVar5;
  int *piVar6;
  double *pdVar7;
  long *plVar8;
  int64_t iVar9;
  TPZVec<int> *in_RDX;
  TPZVec<long> *in_RSI;
  double dVar10;
  int xj_2;
  TPZFNMatrix<80,_double> dphin;
  TPZFNMatrix<80,_double> phin;
  int ord;
  int i;
  int sum;
  int totsum;
  int xj_1;
  int c;
  int transid;
  int i_2;
  TPZManVector<long,_10> ids_1;
  TPZFMatrix<double> dphin_2;
  TPZFMatrix<double> phin_2;
  int ordin_1;
  int ord1;
  REAL store2_1 [60];
  REAL store1_1 [20];
  TPZManVector<double,_2> outval_1;
  int face;
  int xj;
  int i_1;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  int ordin;
  REAL store2 [60];
  REAL store1 [20];
  int id1;
  int id0;
  TPZManVector<double,_1> outvalvec;
  TPZVec<long> ids;
  REAL outval;
  int rib;
  int shape;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  int d;
  int is;
  bool linear;
  TPZVec<long> *in_stack_ffffffffffffe708;
  TPZFMatrix<double> *in_stack_ffffffffffffe710;
  TPZFMatrix<double> *in_stack_ffffffffffffe718;
  _func_int **pp_Var11;
  TPZFMatrix<double> *in_stack_ffffffffffffe720;
  double in_stack_ffffffffffffe728;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffe730;
  TPZFMatrix<double> *in_stack_ffffffffffffe738;
  TPZManVector<double,_1> *in_stack_ffffffffffffe740;
  int64_t in_stack_ffffffffffffe750;
  double *in_stack_ffffffffffffe758;
  TPZVec<double> *in_stack_ffffffffffffe760;
  TPZFMatrix<double> *in_stack_ffffffffffffe768;
  TPZFMatrix<double> *in_stack_ffffffffffffe770;
  int local_167c;
  TPZFMatrix<double> *in_stack_ffffffffffffe9d0;
  TPZFMatrix<double> *in_stack_ffffffffffffe9d8;
  TPZVec<double> *in_stack_ffffffffffffe9e0;
  int local_1044;
  int local_103c;
  int local_1038;
  int local_102c;
  TPZVec<long> local_1028 [3];
  TPZBaseMatrix local_fb8 [9];
  int local_e94;
  undefined4 local_e90;
  int local_e8c;
  int in_stack_fffffffffffff414;
  TPZFMatrix<double> *in_stack_fffffffffffff418;
  TPZFMatrix<double> *in_stack_fffffffffffff420;
  int in_stack_fffffffffffff42c;
  undefined4 in_stack_fffffffffffff430;
  int iVar12;
  int local_bc8;
  int local_bc4;
  TPZVec<long> local_7e8;
  int local_7bc;
  int local_7b8;
  TPZFMatrix<double> *in_stack_fffffffffffffe98;
  TPZFMatrix<double> *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  TPZVec<double> *in_stack_fffffffffffffeb0;
  int local_34;
  int local_30;
  
  CornerShape(&in_stack_ffffffffffffe740->super_TPZVec<double>,in_stack_ffffffffffffe738,
              &in_stack_ffffffffffffe730->super_TPZFMatrix<double>);
  bVar5 = true;
  for (local_30 = 4; local_30 < 0xf; local_30 = local_30 + 1) {
    piVar6 = TPZVec<int>::operator[](in_RDX,(long)local_30 + -4);
    if (1 < *piVar6) {
      bVar5 = false;
    }
  }
  if (!bVar5) {
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe730,(int64_t)in_stack_ffffffffffffe728,
               (int64_t)in_stack_ffffffffffffe720);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe730,(int64_t)in_stack_ffffffffffffe728,
               (int64_t)in_stack_ffffffffffffe720);
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
      dVar10 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
      *pdVar7 = dVar10;
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        *pdVar7 = dVar10;
      }
    }
    ShapeGenerating(in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0);
    local_7b8 = 4;
    for (local_7bc = 0; local_7bc < 6; local_7bc = local_7bc + 1) {
      ProjectPoint3dTetraToRib
                ((int)((ulong)in_stack_ffffffffffffe740 >> 0x20),
                 (TPZVec<double> *)in_stack_ffffffffffffe738,(REAL *)in_stack_ffffffffffffe730);
      TPZVec<long>::TPZVec
                ((TPZVec<long> *)in_stack_ffffffffffffe710,(int64_t)in_stack_ffffffffffffe708);
      TPZManVector<double,_1>::TPZManVector
                (in_stack_ffffffffffffe740,(int64_t)in_stack_ffffffffffffe738,
                 (double *)in_stack_ffffffffffffe730);
      iVar12 = pztopology::TPZTetrahedron::SideNodes[local_7bc][1];
      plVar8 = TPZVec<long>::operator[]
                         (in_RSI,(long)pztopology::TPZTetrahedron::SideNodes[local_7bc][0]);
      lVar4 = *plVar8;
      plVar8 = TPZVec<long>::operator[](&local_7e8,0);
      *plVar8 = lVar4;
      plVar8 = TPZVec<long>::operator[](in_RSI,(long)iVar12);
      lVar4 = *plVar8;
      plVar8 = TPZVec<long>::operator[](&local_7e8,1);
      *plVar8 = lVar4;
      piVar6 = TPZVec<int>::operator[](in_RDX,(long)local_7bc);
      iVar12 = *piVar6;
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_ffffffffffffe770,(int64_t)in_stack_ffffffffffffe768,
                 (int64_t)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758,
                 in_stack_ffffffffffffe750);
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_ffffffffffffe770,(int64_t)in_stack_ffffffffffffe768,
                 (int64_t)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758,
                 in_stack_ffffffffffffe750);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe710);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe710);
      TPZVec<int>::operator[](in_RDX,(long)local_7bc);
      TPZShapeLinear::GetTransformId1d(in_stack_ffffffffffffe708);
      TPZShapeLinear::ShapeInternal
                ((TPZVec<double> *)in_stack_ffffffffffffe730,
                 (int)((ulong)in_stack_ffffffffffffe728 >> 0x20),in_stack_ffffffffffffe720,
                 in_stack_ffffffffffffe718,(int)((ulong)in_stack_ffffffffffffe710 >> 0x20));
      TransformDerivativeFromRibToTetra
                ((int)((ulong)in_stack_ffffffffffffe740 >> 0x20),(int)in_stack_ffffffffffffe740,
                 in_stack_ffffffffffffe738);
      for (local_bc4 = 0; local_bc4 < iVar12 + -1; local_bc4 = local_bc4 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        dVar1 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        *pdVar7 = dVar10 * dVar1;
        for (local_bc8 = 0; local_bc8 < 3; local_bc8 = local_bc8 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          dVar10 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          dVar1 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          dVar2 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          dVar3 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          *pdVar7 = dVar10 * dVar1 + dVar2 * dVar3;
        }
        local_7b8 = local_7b8 + 1;
      }
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18949b6);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18949c3);
      TPZManVector<double,_1>::~TPZManVector((TPZManVector<double,_1> *)in_stack_ffffffffffffe710);
      TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_ffffffffffffe710);
    }
    for (iVar12 = 0; iVar12 < 4; iVar12 = iVar12 + 1) {
      piVar6 = TPZVec<int>::operator[](in_RDX,(long)(iVar12 + 6));
      if (2 < *piVar6) {
        TPZManVector<double,_2>::TPZManVector
                  ((TPZManVector<double,_2> *)in_stack_ffffffffffffe730,
                   (int64_t)in_stack_ffffffffffffe728);
        ProjectPoint3dTetraToFace
                  ((int)((ulong)in_stack_ffffffffffffe770 >> 0x20),
                   (TPZVec<double> *)in_stack_ffffffffffffe768,in_stack_ffffffffffffe760);
        piVar6 = TPZVec<int>::operator[](in_RDX,(long)(iVar12 + 6));
        local_e8c = *piVar6;
        if (local_e8c < 3) {
          local_e90 = 0x16;
        }
        else {
          local_e94 = ((local_e8c + -2) * (local_e8c + -1)) / 2;
          TPZFMatrix<double>::TPZFMatrix
                    (in_stack_ffffffffffffe770,(int64_t)in_stack_ffffffffffffe768,
                     (int64_t)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758,
                     in_stack_ffffffffffffe750);
          TPZFMatrix<double>::TPZFMatrix
                    (in_stack_ffffffffffffe770,(int64_t)in_stack_ffffffffffffe768,
                     (int64_t)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758,
                     in_stack_ffffffffffffe750);
          TPZFMatrix<double>::Zero(in_stack_ffffffffffffe710);
          TPZFMatrix<double>::Zero(in_stack_ffffffffffffe710);
          TPZManVector<long,_10>::TPZManVector
                    ((TPZManVector<long,_10> *)in_stack_ffffffffffffe730,
                     (int64_t)in_stack_ffffffffffffe728);
          for (local_102c = 0; local_102c < 3; local_102c = local_102c + 1) {
            plVar8 = TPZVec<long>::operator[]
                               (in_RSI,(long)pztopology::TPZTetrahedron::FaceNodes[iVar12]
                                             [local_102c]);
            lVar4 = *plVar8;
            plVar8 = TPZVec<long>::operator[](local_1028,(long)local_102c);
            *plVar8 = lVar4;
          }
          TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)in_stack_ffffffffffffe738);
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xfffffffffffff400,0);
          dVar10 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xfffffffffffff400,0);
          *pdVar7 = (dVar10 + 1.0) * 0.5;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xfffffffffffff400,1);
          dVar10 = *pdVar7;
          pdVar7 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xfffffffffffff400,1);
          *pdVar7 = (dVar10 + 1.0) * 0.5;
          TPZShapeTriang::ShapeInternal
                    ((TPZVec<double> *)CONCAT44(iVar12,in_stack_fffffffffffff430),
                     in_stack_fffffffffffff42c,in_stack_fffffffffffff420,in_stack_fffffffffffff418,
                     in_stack_fffffffffffff414);
          iVar9 = TPZBaseMatrix::Cols(local_fb8);
          for (local_102c = 0; local_102c < (int)iVar9; local_102c = local_102c + 1) {
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe728,
                                (int64_t)in_stack_ffffffffffffe720);
            *pdVar7 = *pdVar7 * 0.5;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe728,
                                (int64_t)in_stack_ffffffffffffe720);
            *pdVar7 = *pdVar7 * 0.5;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe728,
                                (int64_t)in_stack_ffffffffffffe720);
            *pdVar7 = *pdVar7 / 2.0;
          }
          TransformDerivativeFromFaceToTetra
                    ((int)((ulong)in_stack_ffffffffffffe770 >> 0x20),(int)in_stack_ffffffffffffe770,
                     in_stack_ffffffffffffe768);
          for (local_102c = 0; local_102c < local_e94; local_102c = local_102c + 1) {
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe728,
                                (int64_t)in_stack_ffffffffffffe720);
            dVar10 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe728,
                                (int64_t)in_stack_ffffffffffffe720);
            dVar1 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe728,
                                (int64_t)in_stack_ffffffffffffe720);
            *pdVar7 = dVar10 * dVar1;
            for (local_1038 = 0; local_1038 < 3; local_1038 = local_1038 + 1) {
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe728,
                                  (int64_t)in_stack_ffffffffffffe720);
              dVar10 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe728,
                                  (int64_t)in_stack_ffffffffffffe720);
              dVar1 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe728,
                                  (int64_t)in_stack_ffffffffffffe720);
              dVar2 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe728,
                                  (int64_t)in_stack_ffffffffffffe720);
              dVar3 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe728,
                                  (int64_t)in_stack_ffffffffffffe720);
              *pdVar7 = dVar10 * dVar1 + dVar2 * dVar3;
            }
            local_7b8 = local_7b8 + 1;
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_ffffffffffffe710)
          ;
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18951d1);
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18951de);
          local_e90 = 0;
        }
        TPZManVector<double,_2>::~TPZManVector((TPZManVector<double,_2> *)in_stack_ffffffffffffe710)
        ;
      }
    }
    piVar6 = TPZVec<int>::operator[](in_RDX,10);
    if (*piVar6 < 4) {
      local_e90 = 1;
    }
    else {
      local_103c = 0;
      for (local_1044 = 0; piVar6 = TPZVec<int>::operator[](in_RDX,10), local_1044 < *piVar6 + -3;
          local_1044 = local_1044 + 1) {
        local_103c = ((local_1044 + 1) * (local_1044 + 2)) / 2 + local_103c;
      }
      TPZFNMatrix<80,_double>::TPZFNMatrix
                ((TPZFNMatrix<80,_double> *)in_stack_ffffffffffffe730,
                 (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
      TPZFNMatrix<80,_double>::TPZFNMatrix
                ((TPZFNMatrix<80,_double> *)in_stack_ffffffffffffe730,
                 (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe710);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe710);
      TPZVec<int>::operator[](in_RDX,10);
      ShapeInternal(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
                    in_stack_fffffffffffffe98);
      for (local_1044 = 0; local_1044 < local_103c; local_1044 = local_1044 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        dVar10 = dVar10 * *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
        *pdVar7 = dVar10;
        for (local_167c = 0; local_167c < 3; local_167c = local_167c + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          dVar10 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          in_stack_ffffffffffffe728 = *pdVar7;
          in_stack_ffffffffffffe730 =
               (TPZFNMatrix<100,_double> *)
               TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
          pp_Var11 = (in_stack_ffffffffffffe730->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                     super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
          in_stack_ffffffffffffe720 =
               (TPZFMatrix<double> *)
               TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_ffffffffffffe730,
                          (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720);
          dVar10 = dVar10 * in_stack_ffffffffffffe728 +
                   (double)pp_Var11 *
                   (double)(in_stack_ffffffffffffe720->super_TPZMatrix<double>).super_TPZBaseMatrix.
                           super_TPZSavable._vptr_TPZSavable;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe730->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe728,(int64_t)in_stack_ffffffffffffe720)
          ;
          *pdVar7 = dVar10;
        }
        local_7b8 = local_7b8 + 1;
      }
      TPZFNMatrix<80,_double>::~TPZFNMatrix((TPZFNMatrix<80,_double> *)0x1895637);
      TPZFNMatrix<80,_double>::~TPZFNMatrix((TPZFNMatrix<80,_double> *)0x1895644);
      local_e90 = 0;
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x189565c);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1895669);
  }
  return;
}

Assistant:

void TPZShapeTetra::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		//  if(order[9]<2) return;
		int shape = 4;
		//rib shapes
		for (int rib = 0; rib < 6; rib++) {
			REAL outval;
			ProjectPoint3dTetraToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int ordin = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToTetra(rib,ordin,dphin);
			for (int i = 0; i < ordin; i++) {
				phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+4) * phin( i, 0) +
					phiblend(rib+4, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[10]<3) return;
		//face shapes
		for (int face = 0; face < 4; face++) {
			if (order[6+face] < 3) continue;
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dTetraToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			//elt->FaceOrder(face,ord1,ord2);
			ord1 = order[6+face];
			//ord2 = ord1;
			if(ord1<3) continue;
			int ordin =  (ord1-2)*(ord1-1)/2;
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(3);
			//	int id0,id1,id2;
			int i;
			for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//    id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			//    id2 = ShapeFaceId[face][2];
			int transid = TPZShapeTriang::GetTransformId2dT(ids);
			outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
			outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..)
			TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			int c = dphin.Cols();
			for(i=0;i<c;i++) {
				dphin(0,i) /= 2.;
				dphin(1,i) /= 2.;
				dphin(2,i) /= 2.;
			}
			TransformDerivativeFromFaceToTetra(face,ordin,dphin);//ord = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+10,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+10) * phin(i ,0) +
					phiblend(face+10, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[10]<4) return;
		//volume shapes
		int totsum = 0,sum;
		int i;
		for(i=0;i<order[10]-3;i++) {
			sum = (i+1)*(i+2) / 2;
			totsum += sum;
		}
		int ord = totsum;
		TPZFNMatrix<80> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[10],phin,dphin);
		for(i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}